

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_UnsafeArenaSwap_Test::~ArenaTest_UnsafeArenaSwap_Test
          (ArenaTest_UnsafeArenaSwap_Test *this)

{
  ArenaTest_UnsafeArenaSwap_Test *this_local;
  
  ~ArenaTest_UnsafeArenaSwap_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, UnsafeArenaSwap) {
  Arena shared_arena;
  TestAllTypes* message1 = Arena::Create<TestAllTypes>(&shared_arena);
  TestAllTypes* message2 = Arena::Create<TestAllTypes>(&shared_arena);
  TestUtil::SetAllFields(message1);
  message1->UnsafeArenaSwap(message2);
  TestUtil::ExpectAllFieldsSet(*message2);
}